

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Organya.cpp
# Opt level: O0

BOOL MakeOrganyaWave(char track,char wave_no,char pipi)

{
  BOOL local_9;
  char pipi_local;
  char wave_no_local;
  char track_local;
  
  if (audio_backend_initialised) {
    if (wave_no < 'd') {
      ReleaseOrganyaObject(track);
      MakeSoundObject8(wave_data[wave_no],track,pipi);
      local_9 = true;
    }
    else {
      local_9 = false;
    }
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

BOOL MakeOrganyaWave(signed char track, signed char wave_no, signed char pipi)
{
	if (!audio_backend_initialised)
		return FALSE;

	if (wave_no > 99)
		return FALSE;

	ReleaseOrganyaObject(track);
	MakeSoundObject8(wave_data[wave_no], track, pipi);

	return TRUE;
}